

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureCopy_24_to_16(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  u32 dy;
  uint uVar7;
  byte *pbVar8;
  u32 dy_1;
  uint uVar9;
  u32 dx;
  ulong uVar10;
  u8 *s;
  ulong uVar11;
  byte *pbVar12;
  
  uVar3 = job->width;
  uVar4 = job->height;
  pvVar6 = job->dst;
  if (job->stretch == true) {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      uVar9 = (int)(long)((float)uVar7 * fVar2) * job->srcPitch;
      pvVar5 = job->src;
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        uVar11 = (long)((float)(uVar10 & 0xffffffff) * fVar1 * 3.0) & 0xffffffff;
        *(ushort *)((long)pvVar6 + uVar10 * 2) =
             (ushort)(*(byte *)((long)pvVar5 + uVar11 + (ulong)uVar9 + 2) >> 3) +
             (*(byte *)((long)pvVar5 + uVar11 + uVar9) & 0xf8) * 0x80 +
             (*(byte *)((long)pvVar5 + uVar11 + (ulong)uVar9 + 1) & 0xf8) * 4 + -0x8000;
      }
      pvVar6 = (void *)((long)pvVar6 + (ulong)job->dstPitch);
    }
  }
  else {
    pbVar8 = (byte *)job->src;
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      pbVar12 = pbVar8;
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        *(ushort *)((long)pvVar6 + uVar10 * 2) =
             (*pbVar12 & 0xf8) * 0x80 + (pbVar12[1] & 0xf8) * 4 + (ushort)(pbVar12[2] >> 3) +
             -0x8000;
        pbVar12 = pbVar12 + 3;
      }
      pbVar8 = pbVar8 + job->srcPitch;
      pvVar6 = (void *)((long)pvVar6 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_24_to_16(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u8 *src = static_cast<const u8 *>(job->src);
	u16 *dst = static_cast<u16 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch * 3.f;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u8 *)(job->src) + job->srcPitch * src_y;

			for (u32 dx = 0; dx < w; ++dx) {
				const u8 *src_x = src + (u32)(dx * wscale);
				dst[dx] = video::RGBA16(src_x[0], src_x[1], src_x[2]);
			}
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			const u8 *s = src;
			for (u32 dx = 0; dx != w; ++dx) {
				dst[dx] = video::RGBA16(s[0], s[1], s[2]);
				s += 3;
			}

			src = src + job->srcPitch;
			dst = (u16 *)((u8 *)(dst) + job->dstPitch);
		}
	}
}